

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::readAssociativeContainer<QHash<QString,QVariant>>
          (QDataStream *s,QHash<QString,_QVariant> *c)

{
  Status SVar1;
  QDataStream *s_00;
  undefined8 uVar2;
  long in_FS_OFFSET;
  quint32 first;
  QString local_88;
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_68,s);
  QHash<QString,_QVariant>::clear(c);
  local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,0xaaaaaaaa);
  QDataStream::operator>>(s,(qint32 *)&local_88);
  uVar2 = (ulong)local_88.d.d & 0xffffffff;
  if ((PrivateShared *)uVar2 == (PrivateShared *)0xfffffffe) {
    if (0x15 < s->ver) {
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(qint64 *)local_58.data);
      uVar2 = local_58.shared;
      if ((long)local_58.shared < 0) goto LAB_002aa597;
    }
  }
  else if ((int)local_88.d.d == -1) {
LAB_002aa597:
    QDataStream::setStatus(s,SizeLimitExceeded);
    goto LAB_002aa67e;
  }
  if ((PrivateShared *)uVar2 != (PrivateShared *)0x0) {
    do {
      uVar2 = (long)&((PrivateShared *)(uVar2 + -8))->offset + 3;
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      local_58._16_8_ = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_40 = 2;
      s_00 = ::operator>>(s,&local_88);
      ::operator>>(s_00,(QVariant *)&local_58);
      SVar1 = QDataStream::status(s);
      if (SVar1 == Ok) {
        QHash<QString,QVariant>::emplace<QVariant_const&>
                  ((QHash<QString,QVariant> *)c,&local_88,(QVariant *)&local_58);
      }
      else {
        QHash<QString,_QVariant>::clear(c);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    } while ((SVar1 == Ok) && ((PrivateShared *)uVar2 != (PrivateShared *)0x0));
  }
LAB_002aa67e:
  if (local_68._8_4_ != Ok) {
    QDataStream::resetStatus((QDataStream *)local_68._0_8_);
    QDataStream::setStatus((QDataStream *)local_68._0_8_,local_68._8_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}